

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_wait.c
# Opt level: O0

void async_wait_ctx_reset_counts(ASYNC_WAIT_CTX *ctx)

{
  undefined8 *in_RDI;
  fd_lookup_st *prev;
  fd_lookup_st *curr;
  void *local_18;
  void *local_10;
  
  local_18 = (void *)0x0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  local_10 = (void *)*in_RDI;
  while (local_10 != (void *)0x0) {
    if (*(int *)((long)local_10 + 0x24) == 0) {
      if (*(int *)((long)local_10 + 0x20) != 0) {
        *(undefined4 *)((long)local_10 + 0x20) = 0;
      }
      local_18 = local_10;
      local_10 = *(void **)((long)local_10 + 0x28);
    }
    else {
      if (local_18 == (void *)0x0) {
        *in_RDI = *(undefined8 *)((long)local_10 + 0x28);
      }
      else {
        *(undefined8 *)((long)local_18 + 0x28) = *(undefined8 *)((long)local_10 + 0x28);
      }
      CRYPTO_free(local_10);
      if (local_18 == (void *)0x0) {
        local_10 = (void *)*in_RDI;
      }
      else {
        local_10 = *(void **)((long)local_18 + 0x28);
      }
    }
  }
  return;
}

Assistant:

void async_wait_ctx_reset_counts(ASYNC_WAIT_CTX *ctx)
{
    struct fd_lookup_st *curr, *prev = NULL;

    ctx->numadd = 0;
    ctx->numdel = 0;

    curr = ctx->fds;

    while (curr != NULL) {
        if (curr->del) {
            if (prev == NULL)
                ctx->fds = curr->next;
            else
                prev->next = curr->next;
            OPENSSL_free(curr);
            if (prev == NULL)
                curr = ctx->fds;
            else
                curr = prev->next;
            continue;
        }
        if (curr->add) {
            curr->add = 0;
        }
        prev = curr;
        curr = curr->next;
    }
}